

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O1

void logdirs_reopen(void)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  tmaxflag = 0;
  taia_now(&now);
  if (dirn != 0) {
    lVar3 = 0;
    uVar4 = 0;
    bVar1 = false;
    do {
      logdir_close((logdir *)((long)&dir->fddir + lVar3));
      uVar2 = logdir_open((logdir *)((long)&dir->fddir + lVar3),fndir[uVar4]);
      if (uVar2 != 0) {
        bVar1 = true;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0xf0;
    } while (uVar4 < dirn);
    if (bVar1) {
      return;
    }
  }
  strerr_die(0x6f,"svlogd: fatal: ","no functional log directories.",(char *)0x0,(char *)0x0,
             (char *)0x0,(char *)0x0,(strerr *)0x0);
  return;
}

Assistant:

void logdirs_reopen(void) {
  int l;
  int ok =0;

  tmaxflag =0;
  taia_now(&now);
  for (l =0; l < dirn; ++l) {
    logdir_close(&dir[l]);
    if (logdir_open(&dir[l], fndir[l])) ok =1;
  }
  if (! ok) fatalx("no functional log directories.");
}